

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_srl(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op3_s390x(tcg_ctx,INDEX_op_shr_i64,(TCGArg)(o->out + (long)tcg_ctx),
                    (TCGArg)(o->in1 + (long)tcg_ctx),(TCGArg)(o->in2 + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_srl(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_shr_i64(tcg_ctx, o->out, o->in1, o->in2);
    return DISAS_NEXT;
}